

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O1

void __thiscall
trento::Event::compute
          (Event *this,Nucleus *nucleusA,Nucleus *nucleusB,NucleonCommon *nucleon_common)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  size_type sVar4;
  pointer pNVar5;
  pointer pCVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  int iVar12;
  pointer pCVar13;
  pointer pNVar14;
  int iVar15;
  Grid *TX;
  int iVar16;
  double *extraout_RDX;
  long lVar17;
  pointer pCVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  Event *pEVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined8 in_XMM14_Qa;
  undefined8 in_XMM14_Qb;
  undefined1 auVar34 [64];
  undefined1 auVar41 [64];
  
  this->npart_ = 0;
  compute_nuclear_thickness(this,nucleusA,nucleon_common,&this->TA_);
  TX = &this->TB_;
  pEVar22 = this;
  compute_nuclear_thickness(this,nucleusB,nucleon_common,TX);
  if ((this->compute_reduced_thickness_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->compute_reduced_thickness_)._M_invoker)((_Any_data *)this);
    compute_observables(this);
    return;
  }
  std::__throw_bad_function_call();
  sVar4 = (TX->super_multi_array_ref<double,_2UL>).
          super_const_multi_array_ref<double,_2UL,_double_*>.num_elements_;
  if (sVar4 != 0) {
    memset((TX->super_multi_array_ref<double,_2UL>).
           super_const_multi_array_ref<double,_2UL,_double_*>.base_ +
           (TX->super_multi_array_ref<double,_2UL>).
           super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_,0,sVar4 << 3);
  }
  pNVar5 = (nucleusB->nucleons_).
           super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pNVar14 = (nucleusB->nucleons_).
                 super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                 _M_impl.super__Vector_impl_data._M_start; pNVar14 != pNVar5; pNVar14 = pNVar14 + 1)
  {
    if (pNVar14->is_participant_ == true) {
      pEVar22->npart_ = pEVar22->npart_ + 1;
      pCVar13 = (pNVar14->constituents_).
                super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar6 = (pNVar14->constituents_).
               super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      dVar44 = pCVar13->x;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = dVar44;
      auVar41 = ZEXT1664(auVar40);
      dVar31 = pCVar13->y;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar31;
      auVar34 = ZEXT1664(auVar32);
      pCVar13 = pCVar13 + 1;
      dVar35 = dVar31;
      dVar39 = dVar44;
      if (pCVar13 != pCVar6) {
        auVar42 = ZEXT1664(auVar40);
        auVar37 = ZEXT1664(auVar32);
        do {
          dVar44 = pCVar13->x;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = dVar44;
          if (auVar41._0_8_ <= dVar44) {
            if (auVar42._0_8_ < dVar44) {
              auVar42 = ZEXT1664(auVar27);
            }
          }
          else {
            auVar41 = ZEXT1664(auVar27);
          }
          dVar39 = auVar41._0_8_;
          dVar44 = auVar42._0_8_;
          dVar31 = pCVar13->y;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = dVar31;
          if (auVar34._0_8_ <= dVar31) {
            if (auVar37._0_8_ < dVar31) {
              auVar37 = ZEXT1664(auVar28);
            }
          }
          else {
            auVar34 = ZEXT1664(auVar28);
          }
          dVar35 = auVar37._0_8_;
          dVar31 = auVar34._0_8_;
          pCVar13 = pCVar13 + 1;
        } while (pCVar13 != pCVar6);
      }
      dVar26 = extraout_RDX[0xc];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar26;
      if (dVar26 < 0.0) {
        dVar26 = sqrt(dVar26);
      }
      else {
        auVar32 = vsqrtsd_avx(auVar29,auVar29);
        dVar26 = auVar32._0_8_;
      }
      dVar1 = pEVar22->xymax_;
      dVar2 = pEVar22->dxy_;
      iVar12 = pEVar22->nsteps_ + -1;
      iVar15 = (int)(((dVar31 - dVar26) + dVar1) / dVar2);
      iVar21 = iVar15;
      if (iVar12 < iVar15) {
        iVar21 = iVar12;
      }
      if (iVar15 < 0) {
        iVar21 = 0;
      }
      iVar16 = (int)((dVar35 + dVar26 + dVar1) / dVar2);
      iVar15 = iVar16;
      if (iVar12 < iVar16) {
        iVar15 = iVar12;
      }
      if (iVar16 < 0) {
        iVar15 = 0;
      }
      if (iVar21 <= iVar15) {
        iVar19 = (int)((dVar44 + dVar26 + dVar1) / dVar2);
        iVar16 = iVar19;
        if (iVar12 < iVar19) {
          iVar16 = iVar12;
        }
        if (iVar19 < 0) {
          iVar16 = 0;
        }
        iVar19 = (int)(((dVar39 - dVar26) + dVar1) / dVar2);
        if (iVar19 <= iVar12) {
          iVar12 = iVar19;
        }
        if (iVar19 < 0) {
          iVar12 = 0;
        }
        lVar7 = (TX->super_multi_array_ref<double,_2UL>).
                super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_;
        pdVar8 = (TX->super_multi_array_ref<double,_2UL>).
                 super_const_multi_array_ref<double,_2UL,_double_*>.base_;
        lVar9 = (TX->super_multi_array_ref<double,_2UL>).
                super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[0];
        lVar10 = (TX->super_multi_array_ref<double,_2UL>).
                 super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[1];
        lVar25 = (long)iVar21;
        do {
          if (iVar12 <= iVar16) {
            pCVar13 = (pNVar14->constituents_).
                      super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar6 = (pNVar14->constituents_).
                     super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            lVar20 = lVar9 * lVar25;
            lVar24 = (long)iVar12;
            do {
              if (pCVar13 == pCVar6) {
                dVar44 = 0.0;
              }
              else {
                auVar36._8_8_ = 0;
                auVar36._0_8_ = pEVar22->dxy_;
                auVar38._8_8_ = 0;
                auVar38._0_8_ = pEVar22->xymax_;
                auVar33._8_8_ = 0;
                auVar33._0_8_ = (double)(int)lVar24 + 0.5;
                auVar32 = vfmsub213sd_fma(auVar33,auVar36,auVar38);
                auVar30._8_8_ = 0;
                auVar30._0_8_ = (double)(int)lVar25 + 0.5;
                auVar40 = vfmsub213sd_fma(auVar36,auVar30,auVar38);
                auVar43._8_8_ = 0;
                auVar43._0_8_ = extraout_RDX[2];
                auVar34 = ZEXT1664(ZEXT816(0));
                pdVar23 = &pCVar13->fluctuation;
                do {
                  dVar44 = auVar32._0_8_ - ((Constituent *)(pdVar23 + -2))->x;
                  dVar31 = auVar40._0_8_ - pdVar23[-1];
                  dVar44 = dVar44 * dVar44 + dVar31 * dVar31;
                  if (dVar44 < extraout_RDX[0xc]) {
                    dVar44 = (dVar44 * -0.5) / extraout_RDX[0xb];
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = (dVar44 - *extraout_RDX) / extraout_RDX[2] + 0.5;
                    lVar17 = vcvttsd2usi_avx512f(auVar47);
                    auVar11._8_8_ = in_XMM14_Qb;
                    auVar11._0_8_ = in_XMM14_Qa;
                    auVar27 = vcvtusi2sd_avx512f(auVar11,lVar17);
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = (dVar44 + 1.0) - *extraout_RDX;
                    auVar27 = vfnmadd213sd_fma(auVar27,auVar43,auVar45);
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = *pdVar23;
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = auVar27._0_8_ * *(double *)((long)extraout_RDX[3] + lVar17 * 8);
                    auVar27 = vfmadd231sd_fma(auVar34._0_16_,auVar46,auVar3);
                    auVar34 = ZEXT1664(auVar27);
                  }
                  dVar44 = auVar34._0_8_;
                  pCVar18 = (pointer)(pdVar23 + 1);
                  pdVar23 = pdVar23 + 3;
                } while (pCVar18 != pCVar6);
              }
              lVar17 = lVar10 * lVar24;
              pdVar8[lVar7 + lVar20 + lVar17] =
                   dVar44 * extraout_RDX[0xe] + pdVar8[lVar7 + lVar20 + lVar17];
              lVar24 = lVar24 + 1;
            } while (iVar16 + 1 != (int)lVar24);
          }
          lVar25 = lVar25 + 1;
        } while (iVar15 + 1 != (int)lVar25);
      }
    }
  }
  return;
}

Assistant:

void Event::compute(const Nucleus& nucleusA, const Nucleus& nucleusB,
                    const NucleonCommon& nucleon_common) {
  // Reset npart; compute_nuclear_thickness() increments it.
  npart_ = 0;
  compute_nuclear_thickness(nucleusA, nucleon_common, TA_);
  compute_nuclear_thickness(nucleusB, nucleon_common, TB_);
  compute_reduced_thickness_();
  compute_observables();
}